

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O0

bool ReplaceMenu(FScanner *sc,FMenuDescriptor *desc)

{
  FMenuDescriptor **ppFVar1;
  FMenuDescriptor *this;
  bool bVar2;
  char *pcVar3;
  FMenuDescriptor **ppFVar4;
  FName local_30;
  FName local_2c;
  FMenuDescriptor **local_28;
  FMenuDescriptor **pOld;
  FMenuDescriptor *desc_local;
  FScanner *sc_local;
  
  pOld = (FMenuDescriptor **)desc;
  desc_local = (FMenuDescriptor *)sc;
  FName::FName(&local_2c,&desc->mMenuName);
  local_28 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
             CheckKey(&MenuDescriptors,&local_2c);
  if ((local_28 != (FMenuDescriptor **)0x0) && (*local_28 != (FMenuDescriptor *)0x0)) {
    bVar2 = CheckCompatible((FMenuDescriptor *)pOld,*local_28);
    this = desc_local;
    if (!bVar2) {
      pcVar3 = FName::GetChars((FName *)(pOld + 1));
      FScanner::ScriptMessage
                ((FScanner *)this,"Tried to replace menu \'%s\' with a menu of different type",
                 pcVar3);
      return true;
    }
    if (*local_28 != (FMenuDescriptor *)0x0) {
      (*(*local_28)->_vptr_FMenuDescriptor[1])();
    }
  }
  ppFVar1 = pOld;
  FName::FName(&local_30,(FName *)(pOld + 1));
  ppFVar4 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
            operator[](&MenuDescriptors,&local_30);
  *ppFVar4 = (FMenuDescriptor *)ppFVar1;
  return false;
}

Assistant:

static bool ReplaceMenu(FScanner &sc, FMenuDescriptor *desc)
{
	FMenuDescriptor **pOld = MenuDescriptors.CheckKey(desc->mMenuName);
	if (pOld != NULL && *pOld != NULL) 
	{
		if (CheckCompatible(desc, *pOld))
		{
			delete *pOld;
		}
		else
		{
			sc.ScriptMessage("Tried to replace menu '%s' with a menu of different type", desc->mMenuName.GetChars());
			return true;
		}
	}
	MenuDescriptors[desc->mMenuName] = desc;
	return false;
}